

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkElementSegment
          (Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *this,
          ElementSegment *segment)

{
  pointer ppEVar1;
  Expression *in_RAX;
  pointer ppEVar2;
  Expression *local_38;
  Expression *expr;
  
  local_38 = in_RAX;
  if ((segment->table).super_IString.str._M_str != (char *)0x0) {
    walk(this,&segment->offset);
  }
  ppEVar1 = (segment->data).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppEVar2 = (segment->data).
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppEVar2 != ppEVar1; ppEVar2 = ppEVar2 + 1) {
    local_38 = *ppEVar2;
    walk(this,&local_38);
  }
  ReFinalize::visitElementSegment((ReFinalize *)&this[-1].stack.fixed._M_elems[9].currp,segment);
  return;
}

Assistant:

void walkElementSegment(ElementSegment* segment) {
    if (segment->table.is()) {
      walk(segment->offset);
    }
    for (auto* expr : segment->data) {
      walk(expr);
    }
    static_cast<SubType*>(this)->visitElementSegment(segment);
  }